

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetImageAdjustForOutput(IceTImage image)

{
  IceTBoolean IVar1;
  IceTEnum IVar2;
  IceTSizeType width;
  IceTSizeType height;
  IceTEnum color_format;
  IceTImage image_local;
  
  IVar1 = icetImageIsNull(image);
  if (((IVar1 == '\0') && (IVar1 = icetIsEnabled(0x144), IVar1 != '\0')) &&
     (IVar2 = icetImageGetColorFormat(image), IVar2 != 0xc000)) {
    *(undefined4 *)((long)image.opaque_internals + 8) = 0xd000;
    width = icetImageGetWidth(image);
    height = icetImageGetHeight(image);
    icetImageSetDimensions(image,width,height);
  }
  return;
}

Assistant:

void icetImageAdjustForOutput(IceTImage image)
{
    IceTEnum color_format;

    if (icetImageIsNull(image)) return;

    ICET_TEST_IMAGE_HEADER(image);

    if (icetIsEnabled(ICET_COMPOSITE_ONE_BUFFER)) {
        color_format = icetImageGetColorFormat(image);
        if (color_format != ICET_IMAGE_COLOR_NONE) {
          /* Set to no depth information. */
            ICET_IMAGE_HEADER(image)[ICET_IMAGE_DEPTH_FORMAT_INDEX]
                = ICET_IMAGE_DEPTH_NONE;
          /* Reset the image size (changes actual buffer size). */
            icetImageSetDimensions(image,
                                   icetImageGetWidth(image),
                                   icetImageGetHeight(image));
        }
    }
}